

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

void set_add_znode_hash(VecZNode *v,ZNode *z)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  ZNode **ppZVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ZNode **__ptr;
  
  uVar5 = v->n;
  uVar9 = CONCAT44(0,uVar5);
  if (uVar9 == 0) {
    v->i = 2;
    uVar8 = 2;
    __ptr = (ZNode **)0x0;
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar9;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = z->pn;
    uVar8 = SUB168(auVar3 % auVar2,0);
    __ptr = v->v;
    if (SUB164(auVar3 % auVar2,0) < uVar5) {
      uVar4 = 0;
      do {
        if (__ptr[uVar8] == (ZNode *)0x0) {
          __ptr[uVar8] = z;
          return;
        }
        uVar7 = (int)uVar8 + 1;
        uVar8 = (ulong)uVar7;
        if (uVar7 == uVar5) {
          uVar8 = 0;
        }
      } while (((uint)uVar8 < uVar5) && (bVar1 = uVar4 < 4, uVar4 = uVar4 + 1, bVar1));
    }
    uVar5 = v->i + 2;
    uVar8 = (ulong)uVar5;
    v->i = uVar5;
  }
  uVar5 = d_prime2[uVar8];
  v->n = uVar5;
  ppZVar6 = (ZNode **)calloc(1,(ulong)uVar5 << 3);
  v->v = ppZVar6;
  if (__ptr != (ZNode **)0x0) {
    if (uVar9 != 0) {
      uVar8 = 0;
      do {
        if (__ptr[uVar8] != (ZNode *)0x0) {
          set_add_znode(v,__ptr[uVar8]);
        }
        uVar8 = uVar8 + 1;
      } while (uVar9 != uVar8);
    }
    free(__ptr);
  }
  set_add_znode(v,z);
  return;
}

Assistant:

static void set_add_znode_hash(VecZNode *v, ZNode *z) {
  uint i, j, n = v->n;
  VecZNode vv;
  vec_clear(&vv);
  if (n) {
    uint h = ((uintptr_t)z->pn) % n;
    for (i = h, j = 0; i < v->n && j < SET_MAX_SEQUENTIAL; i = ((i + 1) % n), j++) {
      if (!v->v[i]) {
        v->v[i] = z;
        return;
      }
    }
  }
  if (!n) {
    vv.v = NULL;
    v->i = INITIAL_SET_SIZE_INDEX;
  } else {
    vv.v = (void *)v->v;
    vv.n = v->n;
    v->i = v->i + 2;
  }
  v->n = d_prime2[v->i];
  v->v = MALLOC(v->n * sizeof(void *));
  memset(v->v, 0, v->n * sizeof(void *));
  if (vv.v) {
    set_union_znode(v, &vv);
    FREE(vv.v);
  }
  set_add_znode(v, z);
}